

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

double __thiscall Net::function(Net *this,double x)

{
  FUNCTIONS FVar1;
  double local_20;
  double x_local;
  Net *this_local;
  
  FVar1 = this->function_type;
  local_20 = x;
  x_local = (double)this;
  if (FVar1 == SIGMOID) {
    this_local = (Net *)sigmoid(&local_20);
  }
  else if (FVar1 == TANH) {
    this_local = (Net *)hyp_tan(&local_20);
  }
  else if (FVar1 == RELU) {
    this_local = (Net *)ReLU(&local_20);
  }
  else {
    this_local = (Net *)0x0;
  }
  return (double)this_local;
}

Assistant:

double Net::function(double x){
    switch (function_type) {
        case SIGMOID:
            return sigmoid(x);
        case TANH:
            return hyp_tan(x);
        case RELU:
            return ReLU(x);
    }
    return 0;
}